

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  _data *this_00;
  int extraout_EAX;
  legacy_sync_pool *this_01;
  pointer *__ptr;
  _Head_base<0UL,_cppcms::applications_pool::factory_*,_false> local_98;
  shared_ptr<cppcms::application_specific_pool> p;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_80;
  unique_lock<std::recursive_mutex> lock;
  attachment local_60;
  
  this_01 = (legacy_sync_pool *)operator_new(0x28);
  local_98._M_head_impl = *(factory **)__special_file;
  __special_file[0] = '\0';
  __special_file[1] = '\0';
  __special_file[2] = '\0';
  __special_file[3] = '\0';
  __special_file[4] = '\0';
  __special_file[5] = '\0';
  __special_file[6] = '\0';
  __special_file[7] = '\0';
  impl::legacy_sync_pool::legacy_sync_pool
            (this_01,(unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
                      *)&local_98);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::legacy_sync_pool,void>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)&p,
             this_01);
  if (local_98._M_head_impl != (factory *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 0x10))();
  }
  local_98._M_head_impl = (factory *)0x0;
  (((p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->d)
  .ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags
            (p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,0x8000);
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&((this->d).ptr_)->lock);
  this_00 = (this->d).ptr_;
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             &p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>);
  _data::attachment::attachment
            (&local_60,(shared_ptr<cppcms::application_specific_pool> *)&local_80,
             (mount_point *)__dir);
  std::__cxx11::
  list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ::push_back(&this_00->apps,&local_60);
  _data::attachment::~attachment(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(std::unique_ptr<factory> aps,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_sync_pool(std::move(aps)));
	p->size(d->thread_count);
	p->flags(app::legacy);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->apps.push_back(_data::attachment(p,mp));
}